

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

void __thiscall QSettings::beginWriteArray(QSettings *this,QAnyStringView prefix,int size)

{
  QLatin1StringView str;
  QAnyStringView key;
  QAnyStringView key_00;
  QSettingsPrivate *this_00;
  int in_ECX;
  size_t in_RSI;
  QAnyStringView *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar1;
  QSettingsPrivate *d;
  size_t in_stack_fffffffffffffef0;
  QVariant *this_01;
  char *pcVar2;
  undefined1 in_stack_ffffffffffffff10 [16];
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_ffffffffffffff70;
  char local_78 [64];
  size_t local_38;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = in_RSI;
  this_00 = d_func((QSettings *)0x7b2a84);
  pcVar2 = local_78;
  key.m_size = (size_t)in_stack_ffffffffffffff68;
  key.field_0.m_data = in_stack_ffffffffffffff60.m_data;
  QSettingsPrivate::normalizedKey(key);
  QSettingsGroup::QSettingsGroup
            ((QSettingsGroup *)this_00,(QString *)in_RDI,SUB81(in_stack_fffffffffffffef0 >> 0x38,0))
  ;
  QSettingsPrivate::beginGroupOrArray
            (in_stack_ffffffffffffff10._8_8_,in_stack_ffffffffffffff10._0_8_);
  QSettingsGroup::~QSettingsGroup((QSettingsGroup *)0x7b2b01);
  QString::~QString((QString *)0x7b2b0e);
  if (in_ECX < 0) {
    Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,in_stack_fffffffffffffef0);
    QVar1.m_data = pcVar2;
    QVar1.m_size = (qsizetype)this_00;
    QAnyStringView::QAnyStringView(in_RDI,QVar1);
    remove((QSettings *)in_RDI,in_stack_ffffffffffffff68);
  }
  else {
    QVar1 = Qt::Literals::StringLiterals::operator____L1((char *)in_RDI,in_stack_fffffffffffffef0);
    str.m_data = pcVar2;
    str.m_size = (qsizetype)this_00;
    QAnyStringView::QAnyStringView(in_RDI,str);
    this_01 = &local_28;
    ::QVariant::QVariant(this_01,(int)((ulong)in_RDI >> 0x20));
    key_00.m_size = local_38;
    key_00.field_0.m_data = in_stack_ffffffffffffff70.m_data;
    setValue((QSettings *)QVar1.m_data,key_00,(QVariant *)QVar1.m_size);
    ::QVariant::~QVariant(this_01);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSettings::beginWriteArray(QAnyStringView prefix, int size)
{
    Q_D(QSettings);
    d->beginGroupOrArray(QSettingsGroup(d->normalizedKey(prefix), size < 0));

    if (size < 0)
        remove("size"_L1);
    else
        setValue("size"_L1, size);
}